

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Instr * __thiscall
GlobOpt::TypeSpecialization
          (GlobOpt *this,Instr *instr,Value **pSrc1Val,Value **pSrc2Val,Value **pDstVal,
          bool *redoTypeSpecRef,bool *forceInvariantHoistingRef)

{
  char cVar1;
  OpCode OVar2;
  Value *src1OriginalVal;
  Value *src2OriginalVal;
  Value *pVVar3;
  Instr *instr_00;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  OpndKind OVar7;
  byte bVar8;
  BailOutKind BVar9;
  undefined4 *puVar10;
  FloatConstantValueInfo *pFVar11;
  Value *pVVar12;
  Instr *pIVar13;
  undefined7 extraout_var_00;
  SymOpnd *pSVar14;
  StackSym *varSym;
  Value **pDstVal_00;
  char *this_00;
  GlobOpt *pGVar15;
  IntConstantBounds local_50;
  bool isInt32;
  int32 iStack_44;
  int32 int32Value;
  Instr *local_38;
  Instr *instr_local;
  undefined7 extraout_var;
  
  *redoTypeSpecRef = false;
  _int32Value = (Value *)pDstVal;
  local_38 = instr;
  if (*forceInvariantHoistingRef == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1871,"(!*forceInvariantHoistingRef)","!*forceInvariantHoistingRef");
    if (!bVar5) goto LAB_00451d67;
    *puVar10 = 0;
  }
  this->field_0xf4 = this->field_0xf4 & 0xf3;
  src1OriginalVal = *pSrc1Val;
  src2OriginalVal = *pSrc2Val;
  bVar5 = IR::Instr::ShouldCheckForIntOverflow(local_38);
  if (!bVar5) {
    if ((*pSrc1Val != (Value *)0x0) &&
       (bVar5 = ValueInfo::IsFloatConstant((*pSrc1Val)->valueInfo), bVar5)) {
      pFVar11 = ValueInfo::AsFloatConstant((*pSrc1Val)->valueInfo);
      bVar5 = Js::JavascriptNumber::TryGetInt32OrUInt32Value
                        (pFVar11->floatValue,(int32 *)&isInt32,(bool *)&local_50);
      if (bVar5) {
        pVVar12 = GetIntConstantValue(this,_isInt32,local_38,(Opnd *)0x0);
        *pSrc1Val = pVVar12;
        if ((char)local_50.lowerBound == '\0') {
          this->field_0xf4 = this->field_0xf4 | 4;
        }
      }
    }
    if ((*pSrc2Val != (Value *)0x0) &&
       (bVar5 = ValueInfo::IsFloatConstant((*pSrc2Val)->valueInfo), bVar5)) {
      pFVar11 = ValueInfo::AsFloatConstant((*pSrc2Val)->valueInfo);
      bVar5 = Js::JavascriptNumber::TryGetInt32OrUInt32Value
                        (pFVar11->floatValue,(int32 *)&isInt32,(bool *)&local_50);
      if (bVar5) {
        pVVar12 = GetIntConstantValue(this,_isInt32,local_38,(Opnd *)0x0);
        *pSrc2Val = pVVar12;
        if ((char)local_50.lowerBound == '\0') {
          this->field_0xf4 = this->field_0xf4 | 4;
        }
      }
    }
  }
  pVVar12 = *pSrc1Val;
  pVVar3 = *pSrc2Val;
  if ((pVVar12 == (Value *)0x0) || (local_38->m_src2 != (Opnd *)0x0)) {
    if ((local_38->m_src2 != (Opnd *)0x0) &&
       ((local_38->m_kind != InstrKindBranch && (this->prePassLoop == (Loop *)0x0)))) {
      if ((this->field_0xf7 & 2) == 0) {
        _isInt32 = 0;
        iStack_44 = 0;
        local_50.lowerBound = 0;
        local_50.upperBound = 0;
        bVar5 = true;
        pIVar13 = (Instr *)0x0;
        if (pVVar12 != (Value *)0x0) {
          bVar5 = ValueInfo::TryGetIntConstantBounds
                            (pVVar12->valueInfo,(IntConstantBounds *)&isInt32,false);
          pIVar13 = (Instr *)CONCAT71(extraout_var,bVar5);
          if ((bVar5) && (pIVar13 = (Instr *)*pSrc2Val, pIVar13 != (Instr *)0x0)) {
            bVar6 = ValueInfo::TryGetIntConstantBounds
                              (*(ValueInfo **)&pIVar13->m_noLazyHelperAssert,&local_50,false);
            bVar5 = true;
            pIVar13 = (Instr *)CONCAT71(extraout_var_00,bVar6);
            if (bVar6) {
              pDstVal = (Value **)_int32Value;
              bVar5 = OptConstFoldBinary(this,&local_38,(IntConstantBounds *)&isInt32,&local_50,
                                         (Value **)_int32Value);
              bVar5 = !bVar5;
              pIVar13 = local_38;
            }
          }
          else {
            bVar5 = true;
          }
        }
        if (!bVar5) goto LAB_00451d3c;
      }
      else if (DAT_015aa2e3 == '\x01') {
        bVar5 = IRType_IsInt64(local_38->m_src1->m_type);
        pDstVal = (Value **)_int32Value;
        if (bVar5) {
          bVar5 = OptConstFoldBinaryWasm<long>
                            (this,&local_38,*pSrc1Val,*pSrc2Val,(Value **)_int32Value);
        }
        else {
          bVar5 = OptConstFoldBinaryWasm<int>
                            (this,&local_38,*pSrc1Val,*pSrc2Val,(Value **)_int32Value);
        }
        pIVar13 = local_38;
        if (bVar5 != false) goto LAB_00451d3c;
      }
    }
  }
  else {
    if (((this->prePassLoop == (Loop *)0x0) && (local_38->m_kind != InstrKindBranch)) &&
       (bVar5 = ValueInfo::TryGetIntConstantValue(pVVar12->valueInfo,(int32 *)&isInt32,false), bVar5
       )) {
      OVar2 = local_38->m_opcode;
      if (OVar2 < MultiBr) {
        if ((OVar2 == StElemI_A) || (OVar2 == StElemI_A_Strict)) goto LAB_00451975;
      }
      else if ((OVar2 == MultiBr) || ((OVar2 == StElemC || (OVar2 == InlineArrayPop))))
      goto LAB_00451975;
      pDstVal = (Value **)_int32Value;
      bVar8 = OptConstFoldUnary(this,&local_38,_isInt32,*pSrc1Val == src1OriginalVal,
                                (Value **)_int32Value);
LAB_004519a9:
      bVar8 = bVar8 ^ 1;
    }
    else {
LAB_00451975:
      pDstVal = (Value **)src1OriginalVal;
      bVar5 = TypeSpecializeUnary(this,&local_38,pSrc1Val,(Value **)_int32Value,src1OriginalVal,
                                  redoTypeSpecRef,forceInvariantHoistingRef);
      if (!bVar5) {
        bVar8 = *redoTypeSpecRef;
        goto LAB_004519a9;
      }
      bVar8 = 0;
    }
    pIVar13 = local_38;
    if (bVar8 == 0) goto LAB_00451d3c;
  }
  if ((local_38->m_src2 == (Opnd *)0x0) ||
     (pDstVal_00 = pSrc2Val, pDstVal = (Value **)_int32Value,
     bVar5 = TypeSpecializeBinary
                       (this,&local_38,pSrc1Val,pSrc2Val,(Value **)_int32Value,src1OriginalVal,
                        src2OriginalVal,redoTypeSpecRef), !bVar5)) {
    pIVar13 = local_38;
    if ((*redoTypeSpecRef == false) &&
       (((local_38->m_kind != InstrKindBranch || (this->prePassLoop != (Loop *)0x0)) ||
        (bVar5 = OptConstFoldBranch(this,local_38,*pSrc1Val,*pSrc2Val,pDstVal), pIVar13 = local_38,
        !bVar5)))) {
      if (local_38->m_src1 != (Opnd *)0x0) {
        local_38 = ToVarUses(this,local_38,local_38->m_src1,false,*pSrc1Val);
        if (local_38->m_src2 != (Opnd *)0x0) {
          local_38 = ToVarUses(this,local_38,local_38->m_src2,false,*pSrc2Val);
        }
      }
      pGVar15 = (GlobOpt *)local_38->m_dst;
      pIVar13 = local_38;
      if (pGVar15 != (GlobOpt *)0x0) {
        local_38 = ToVarUses(this,local_38,(Opnd *)pGVar15,true,(Value *)0x0);
        bVar5 = OpCodeAttr::IsInlineBuiltIn(local_38->m_opcode);
        if ((bVar5) && ((this->field_0xf7 & 2) == 0)) {
          TypeSpecializeInlineBuiltInDst(this,&local_38,(Value **)_int32Value);
          pIVar13 = local_38;
        }
        else {
          OVar7 = IR::Opnd::GetKind((Opnd *)pGVar15);
          if (OVar7 == OpndKindReg) {
            this_00 = (char *)pGVar15;
            OVar7 = IR::Opnd::GetKind((Opnd *)pGVar15);
            if (OVar7 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              _int32Value = (Value *)__tls_get_addr(&PTR_0155fe48);
              _int32Value->valueNumber = 1;
              this_00 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
              ;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar5) {
LAB_00451d67:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              _int32Value->valueNumber = 0;
            }
            instr_00 = (Instr *)pGVar15->intConstantToStackSymMap;
            if (((ulong)instr_00->m_prev & 0x10000) == 0) {
              ToVarStackSym((GlobOpt *)this_00,(StackSym *)instr_00,this->currentBlock);
              pIVar13 = local_38;
            }
            else {
              cVar1 = *(char *)((long)&instr_00->m_prev + 4);
              if (cVar1 == '\n') {
                ToFloat64Dst(this,local_38,(RegOpnd *)pGVar15,this->currentBlock);
                pIVar13 = local_38;
              }
              else {
                pIVar13 = local_38;
                if (cVar1 == '\a') {
                  if ((this->field_0xf7 & 2) != 0) {
                    ToUInt32Dst(this,instr_00,(RegOpnd *)pGVar15,this->currentBlock);
                    pIVar13 = local_38;
                  }
                }
                else if (cVar1 == '\x03') {
                  ToInt32Dst(this,local_38,(RegOpnd *)pGVar15,this->currentBlock);
                  pIVar13 = local_38;
                }
              }
            }
          }
          else {
            OVar7 = IR::Opnd::GetKind((Opnd *)pGVar15);
            pIVar13 = local_38;
            if (OVar7 == OpndKindSym) {
              OVar7 = IR::Opnd::GetKind((Opnd *)pGVar15);
              if (OVar7 != OpndKindSym) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                _int32Value = (Value *)__tls_get_addr(&PTR_0155fe48);
                _int32Value->valueNumber = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
                if (!bVar5) goto LAB_00451d67;
                _int32Value->valueNumber = 0;
              }
              pIVar13 = local_38;
              if ((((StackSym *)pGVar15->intConstantToStackSymMap)->super_Sym).m_kind ==
                  SymKindStack) {
                pSVar14 = IR::Opnd::AsSymOpnd((Opnd *)pGVar15);
                pGVar15 = (GlobOpt *)pSVar14->m_sym;
                varSym = Sym::AsStackSym((Sym *)pGVar15);
                ToVarStackSym(pGVar15,varSym,this->currentBlock);
                pIVar13 = local_38;
              }
            }
          }
        }
      }
    }
  }
  else {
    pIVar13 = local_38;
    if (((this->prePassLoop == (Loop *)0x0) && (local_38->m_opcode != Nop)) &&
       ((local_38->m_opcode != Br &&
        (((local_38->field_0x38 & 0x10) == 0 ||
         (BVar9 = IR::Instr::GetBailOutKind(local_38), pIVar13 = local_38,
         (BVar9 & BailOutOnResultConditions) == BailOutInvalid)))))) {
      if ((*pSrc1Val == (Value *)0x0) ||
         (bVar5 = ValueInfo::HasIntConstantValue((*pSrc1Val)->valueInfo,false), !bVar5)) {
        pIVar13 = local_38;
        if ((*pSrc2Val != (Value *)0x0) &&
           (bVar5 = ValueInfo::HasIntConstantValue((*pSrc2Val)->valueInfo,false), pIVar13 = local_38
           , bVar5)) {
          OptConstPeep(this,local_38,local_38->m_src2,pDstVal_00,(*pSrc2Val)->valueInfo);
          pIVar13 = local_38;
        }
      }
      else {
        OptConstPeep(this,local_38,local_38->m_src1,pDstVal_00,(*pSrc1Val)->valueInfo);
        pIVar13 = local_38;
      }
    }
  }
LAB_00451d3c:
  if (*pSrc2Val == pVVar3) {
    *pSrc2Val = src2OriginalVal;
  }
  if (*pSrc1Val == pVVar12) {
    *pSrc1Val = src1OriginalVal;
  }
  return pIVar13;
}

Assistant:

IR::Instr *
GlobOpt::TypeSpecialization(
    IR::Instr *instr,
    Value **pSrc1Val,
    Value **pSrc2Val,
    Value **pDstVal,
    bool *redoTypeSpecRef,
    bool *const forceInvariantHoistingRef)
{
    Value *&src1Val = *pSrc1Val;
    Value *&src2Val = *pSrc2Val;
    *redoTypeSpecRef = false;
    Assert(!*forceInvariantHoistingRef);

    this->ignoredIntOverflowForCurrentInstr = false;
    this->ignoredNegativeZeroForCurrentInstr = false;

    // - Int32 values that can't be tagged are created as float constant values instead because a JavascriptNumber var is needed
    //   for that value at runtime. For the purposes of type specialization, recover the int32 values so that they will be
    //   treated as ints.
    // - If int overflow does not matter for the instruction, we can additionally treat uint32 values as int32 values because
    //   the value resulting from the operation will eventually be converted to int32 anyway
    Value *const src1OriginalVal = src1Val;
    Value *const src2OriginalVal = src2Val;

    if(!instr->ShouldCheckForIntOverflow())
    {
        if(src1Val && src1Val->GetValueInfo()->IsFloatConstant())
        {
            int32 int32Value;
            bool isInt32;
            if(Js::JavascriptNumber::TryGetInt32OrUInt32Value(
                    src1Val->GetValueInfo()->AsFloatConstant()->FloatValue(),
                    &int32Value,
                    &isInt32))
            {
                src1Val = GetIntConstantValue(int32Value, instr);
                if(!isInt32)
                {
                    this->ignoredIntOverflowForCurrentInstr = true;
                }
            }
        }
        if(src2Val && src2Val->GetValueInfo()->IsFloatConstant())
        {
            int32 int32Value;
            bool isInt32;
            if(Js::JavascriptNumber::TryGetInt32OrUInt32Value(
                    src2Val->GetValueInfo()->AsFloatConstant()->FloatValue(),
                    &int32Value,
                    &isInt32))
            {
                src2Val = GetIntConstantValue(int32Value, instr);
                if(!isInt32)
                {
                    this->ignoredIntOverflowForCurrentInstr = true;
                }
            }
        }
    }
    const AutoRestoreVal autoRestoreSrc1Val(src1OriginalVal, &src1Val);
    const AutoRestoreVal autoRestoreSrc2Val(src2OriginalVal, &src2Val);

    if (src1Val && instr->GetSrc2() == nullptr)
    {
        // Unary
        // Note make sure that native array StElemI gets to TypeSpecializeStElem. Do this for typed arrays, too?
        int32 intConstantValue;
        if (!this->IsLoopPrePass() &&
            !instr->IsBranchInstr() &&
            src1Val->GetValueInfo()->TryGetIntConstantValue(&intConstantValue) &&
            !(
                // Nothing to fold for element stores. Go into type specialization to see if they can at least be specialized.
                instr->m_opcode == Js::OpCode::StElemI_A ||
                instr->m_opcode == Js::OpCode::StElemI_A_Strict ||
                instr->m_opcode == Js::OpCode::StElemC ||
                instr->m_opcode == Js::OpCode::MultiBr ||
                instr->m_opcode == Js::OpCode::InlineArrayPop
            ))
        {
            if (OptConstFoldUnary(&instr, intConstantValue, src1Val == src1OriginalVal, pDstVal))
            {
                return instr;
            }
        }
        else if (this->TypeSpecializeUnary(
                    &instr,
                    &src1Val,
                    pDstVal,
                    src1OriginalVal,
                    redoTypeSpecRef,
                    forceInvariantHoistingRef))
        {
            return instr;
        }
        else if(*redoTypeSpecRef)
        {
            return instr;
        }
    }
    else if (instr->GetSrc2() && !instr->IsBranchInstr())
    {
        // Binary
        if (!this->IsLoopPrePass())
        {
            if (GetIsAsmJSFunc())
            {
                if (CONFIG_FLAG(WasmFold))
                {
                    bool success = instr->GetSrc1()->IsInt64() ?
                        this->OptConstFoldBinaryWasm<int64>(&instr, src1Val, src2Val, pDstVal) :
                        this->OptConstFoldBinaryWasm<int>(&instr, src1Val, src2Val, pDstVal);

                    if (success)
                    {
                        return instr;
                    }
                }
            }
            else
            {
                // OptConstFoldBinary doesn't do type spec, so only deal with things we are sure are int (IntConstant and IntRange)
                // and not just likely ints  TypeSpecializeBinary will deal with type specializing them and fold them again
                IntConstantBounds src1IntConstantBounds, src2IntConstantBounds;
                if (src1Val && src1Val->GetValueInfo()->TryGetIntConstantBounds(&src1IntConstantBounds))
                {
                    if (src2Val && src2Val->GetValueInfo()->TryGetIntConstantBounds(&src2IntConstantBounds))
                    {
                        if (this->OptConstFoldBinary(&instr, src1IntConstantBounds, src2IntConstantBounds, pDstVal))
                        {
                            return instr;
                        }
                    }
                }
            }
        }
    }
    if (instr->GetSrc2() && this->TypeSpecializeBinary(&instr, pSrc1Val, pSrc2Val, pDstVal, src1OriginalVal, src2OriginalVal, redoTypeSpecRef))
    {
        if (!this->IsLoopPrePass() &&
            instr->m_opcode != Js::OpCode::Nop &&
            instr->m_opcode != Js::OpCode::Br &&    // We may have const fold a branch

            // Cannot const-peep if the result of the operation is required for a bailout check
            !(instr->HasBailOutInfo() && instr->GetBailOutKind() & IR::BailOutOnResultConditions))
        {
            if (src1Val && src1Val->GetValueInfo()->HasIntConstantValue())
            {
                if (this->OptConstPeep(instr, instr->GetSrc1(), pDstVal, src1Val->GetValueInfo()))
                {
                    return instr;
                }
            }
            else if (src2Val && src2Val->GetValueInfo()->HasIntConstantValue())
            {
                if (this->OptConstPeep(instr, instr->GetSrc2(), pDstVal, src2Val->GetValueInfo()))
                {
                    return instr;
                }
            }
        }
        return instr;
    }
    else if(*redoTypeSpecRef)
    {
        return instr;
    }

    if (instr->IsBranchInstr() && !this->IsLoopPrePass())
    {
        if (this->OptConstFoldBranch(instr, src1Val, src2Val, pDstVal))
        {
            return instr;
        }
    }
    // We didn't type specialize, make sure the srcs are unspecialized
    IR::Opnd *src1 = instr->GetSrc1();
    if (src1)
    {
        instr = this->ToVarUses(instr, src1, false, src1Val);

        IR::Opnd *src2 = instr->GetSrc2();
        if (src2)
        {
            instr = this->ToVarUses(instr, src2, false, src2Val);
        }
    }

    IR::Opnd *dst = instr->GetDst();
    if (dst)
    {
        instr = this->ToVarUses(instr, dst, true, nullptr);

        // Handling for instructions other than built-ins that may require only dst type specialization
        // should be added here.
        if(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode) && !GetIsAsmJSFunc()) // don't need to do typespec for asmjs
        {
            this->TypeSpecializeInlineBuiltInDst(&instr, pDstVal);
            return instr;
        }

        // Clear the int specialized bit on the dst.
        if (dst->IsRegOpnd())
        {
            IR::RegOpnd *dstRegOpnd = dst->AsRegOpnd();
            if (!dstRegOpnd->m_sym->IsTypeSpec())
            {
                this->ToVarRegOpnd(dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsInt32())
            {
                this->ToInt32Dst(instr, dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsUInt32() && GetIsAsmJSFunc())
            {
                this->ToUInt32Dst(instr, dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsFloat64())
            {
                this->ToFloat64Dst(instr, dstRegOpnd, this->currentBlock);
            }
        }
        else if (dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsStackSym())
        {
            this->ToVarStackSym(dst->AsSymOpnd()->m_sym->AsStackSym(), this->currentBlock);
        }
    }

    return instr;
}